

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void __thiscall LTChannel::_Main(LTChannel *this)

{
  this->eThrStatus = THR_RUNNING;
  if ((int)dataRefs.iLogLevel < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
           ,0xcc,"_Main",logDEBUG,"%s: Thread starts",this->pszChName);
  }
  (*this->_vptr_LTChannel[5])(this);
  if ((int)dataRefs.iLogLevel < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
           ,0xce,"_Main",logDEBUG,"%s: Thread ends",this->pszChName);
  }
  this->eThrStatus = THR_ENDED;
  return;
}

Assistant:

void LTChannel::_Main()
{
    eThrStatus = THR_RUNNING;
    LOG_MSG(logDEBUG, "%s: Thread starts", pszChName);
    Main();
    LOG_MSG(logDEBUG, "%s: Thread ends", pszChName);
    eThrStatus = THR_ENDED;
}